

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

bool __thiscall kj::HttpHeaders::parseHeaders(HttpHeaders *this,char *ptr,char *end)

{
  NullableValue<kj::StringPtr> *other;
  StringPtr *pSVar1;
  ArrayPtr<const_char> *pAVar2;
  StringPtr value;
  StringPtr line;
  StringPtr *name;
  Maybe<kj::StringPtr> local_58;
  undefined1 local_40 [8];
  NullableValue<kj::StringPtr> _name1044;
  char *end_local;
  char *ptr_local;
  HttpHeaders *this_local;
  
  _name1044.field_1.value.content.size_ = (size_t)end;
  end_local = ptr;
  ptr_local = (char *)this;
  do {
    if (*end_local == '\0') {
      this_local._7_1_ = end_local == (char *)_name1044.field_1.value.content.size_;
      break;
    }
    consumeHeaderName(&local_58,&end_local);
    other = kj::_::readMaybe<kj::StringPtr>(&local_58);
    kj::_::NullableValue<kj::StringPtr>::NullableValue
              ((NullableValue<kj::StringPtr> *)local_40,other);
    Maybe<kj::StringPtr>::~Maybe(&local_58);
    pSVar1 = kj::_::NullableValue::operator_cast_to_StringPtr_((NullableValue *)local_40);
    if (pSVar1 == (StringPtr *)0x0) {
      this_local._7_1_ = 0;
    }
    else {
      pAVar2 = &kj::_::NullableValue<kj::StringPtr>::operator*
                          ((NullableValue<kj::StringPtr> *)local_40)->content;
      value = consumeLine(&end_local);
      addNoCheck(this,(StringPtr)*pAVar2,value);
    }
    kj::_::NullableValue<kj::StringPtr>::~NullableValue((NullableValue<kj::StringPtr> *)local_40);
  } while (pSVar1 != (StringPtr *)0x0);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool HttpHeaders::parseHeaders(char* ptr, char* end) {
  while (*ptr != '\0') {
    KJ_IF_SOME(name, consumeHeaderName(ptr)) {
      kj::StringPtr line = consumeLine(ptr);
      addNoCheck(name, line);
    } else {
      return false;
    }
  }

  return ptr == end;
}